

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::
PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>::
~PromiseDataBase(PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
                 *this)

{
  PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
  *this_local;
  
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001b6828;
  PromiseError::~PromiseError(&this->m_error);
  QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
  ::~QList(&this->m_catchers);
  QList<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
  ::~QList((QList<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
            *)&this->m_handlers);
  QReadWriteLock::~QReadWriteLock(&this->m_lock);
  return;
}

Assistant:

virtual ~PromiseDataBase() { }